

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

void __thiscall QLabelPrivate::linkHovered(QLabelPrivate *this,QString *anchor)

{
  QWidget *this_00;
  QCursorData *pQVar1;
  bool bVar2;
  ushort uVar3;
  long in_FS_OFFSET;
  QCursorData *local_40;
  QCursor local_38;
  QString *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  if ((anchor->d).size == 0) {
    if ((*(ushort *)&this->field_0x340 & 0x40) == 0) {
      QWidget::unsetCursor(this_00);
    }
    else {
      QWidget::setCursor(this_00,&this->cursor);
    }
    uVar3 = *(ushort *)&this->field_0x340 & 0xff7f;
  }
  else {
    if ((char)*(ushort *)&this->field_0x340 < '\0') goto LAB_004124d4;
    bVar2 = QWidget::testAttribute_helper(this_00,WA_SetCursor);
    *(ushort *)&this->field_0x340 =
         (ushort)*(undefined4 *)&this->field_0x340 & 0xffbf | (ushort)bVar2 << 6;
    if (bVar2) {
      QWidget::cursor((QWidget *)&local_40);
      pQVar1 = local_40;
      local_40 = (QCursorData *)0x0;
      local_38.d = (this->cursor).d;
      (this->cursor).d = pQVar1;
      QCursor::~QCursor(&local_38);
      QCursor::~QCursor((QCursor *)&local_40);
    }
    QCursor::QCursor(&local_38,PointingHandCursor);
    QWidget::setCursor(this_00,&local_38);
    QCursor::~QCursor(&local_38);
    uVar3 = (ushort)*(undefined4 *)&this->field_0x340 | 0x80;
  }
  *(ushort *)&this->field_0x340 = uVar3;
LAB_004124d4:
  local_38.d = (QCursorData *)0x0;
  local_30 = anchor;
  QMetaObject::activate(&this_00->super_QObject,&QLabel::staticMetaObject,1,&local_38.d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::linkHovered(const QString &anchor)
{
    Q_Q(QLabel);
#ifndef QT_NO_CURSOR
    if (anchor.isEmpty()) { // restore cursor
        if (validCursor)
            q->setCursor(cursor);
        else
            q->unsetCursor();
        onAnchor = false;
    } else if (!onAnchor) {
        validCursor = q->testAttribute(Qt::WA_SetCursor);
        if (validCursor) {
            cursor = q->cursor();
        }
        q->setCursor(Qt::PointingHandCursor);
        onAnchor = true;
    }
#endif
    emit q->linkHovered(anchor);
}